

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool __thiscall
google::anon_unknown_10::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  int __fd;
  char *__file;
  FILE *pFVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  char *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  char *linkdest;
  string local_128 [32];
  string local_108 [8];
  string linkpath;
  undefined1 local_c8 [8];
  string linkname;
  char *slash;
  int fd;
  char *filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string string_filename;
  string *time_pid_string_local;
  LogFileObject *this_local;
  
  string_filename.field_2._8_8_ = time_pid_string;
  std::operator+(&local_80,&this->base_filename_,&this->filename_extension_);
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 string_filename.field_2._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".log");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  __file = (char *)std::__cxx11::string::c_str();
  __fd = open(__file,0xc1,(ulong)fLI::FLAGS_logfile_mode);
  if (__fd == -1) {
    this_local._7_1_ = false;
  }
  else {
    fcntl(__fd,2,1);
    pFVar1 = fdopen(__fd,"a");
    this->file_ = (FILE *)pFVar1;
    if (this->file_ == (FILE *)0x0) {
      close(__fd);
      unlink(__file);
      this_local._7_1_ = false;
    }
    else {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        linkname.field_2._8_8_ = strrchr(__file,0x2f);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&linkpath.field_2 + 8),&this->symlink_basename_,'.');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&linkpath.field_2 + 8),
                       *(char **)(LogSeverityNames + (long)this->severity_ * 8));
        std::__cxx11::string::~string((string *)(linkpath.field_2._M_local_buf + 8));
        std::__cxx11::string::string(local_108);
        if (linkname.field_2._8_8_ != 0) {
          lVar3 = linkname.field_2._8_8_ - (long)__file;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_128,__file,lVar3 + 1,(allocator *)((long)&linkdest + 7));
          std::__cxx11::string::operator=(local_108,local_128);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)((long)&linkdest + 7));
        }
        std::__cxx11::string::operator+=(local_108,(string *)local_c8);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        unlink(pcVar4);
        local_1b0 = __file;
        if (linkname.field_2._8_8_ != 0) {
          local_1b0 = (char *)(linkname.field_2._8_8_ + 1);
        }
        local_138 = local_1b0;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        symlink(local_1b0,pcVar4);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          std::operator+(&local_178,fLS::FLAGS_log_link_abi_cxx11_,"/");
          std::operator+(&local_158,&local_178,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8);
          std::__cxx11::string::operator=(local_108,(string *)&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          unlink(pcVar4);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          symlink(__file,pcVar4);
        }
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string((string *)local_c8);
      }
      this_local._7_1_ = true;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  // string string_filename = base_filename_+filename_extension_+
  //                          time_pid_string;
  // @huihut: path + severity + '_' + file name + ".log"
  string string_filename = base_filename_ + filename_extension_ + time_pid_string + ".log";
  const char* filename = string_filename.c_str();
  int fd = open(filename, O_WRONLY | O_CREAT | O_EXCL, FLAGS_logfile_mode);
  if (fd == -1) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd, F_SETFD, FD_CLOEXEC);
#endif

  file_ = fdopen(fd, "a");  // Make a FILE*.
  if (file_ == NULL) {  // Man, we're screwed!
    close(fd);
    unlink(filename);  // Erase the half-baked evidence: an unusable log file
    return false;
  }

  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
      symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if ( slash ) linkpath = string(filename, slash-filename+1);  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());                    // delete old one if it exists

#if defined(OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char *linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());                  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}